

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O0

void __thiscall
CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,char_const(&)[71]>
          (CQueue *this,int nTimer,string *from,string *funcName,
          _func_void_char_data_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
          *func,char_data **args,char (*args_1) [71])

{
  string_view fmt;
  string_view fmt_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string *in_RDX;
  int in_ESI;
  vector<char_data_*,_std::allocator<char_data_*>_> *in_RDI;
  anon_class_88_3_3bdf3dc2 *in_stack_00000008;
  vector<char_data_*,_std::allocator<char_data_*>_> chs;
  tuple<char_data_*&,_const_char_(&)[71]> tuple;
  char_data **in_stack_fffffffffffffe38;
  value_type *__x;
  tuple<char_data_*&,_const_char_(&)[71]> *in_stack_fffffffffffffe40;
  queueEntry_t *this_00;
  char *in_stack_fffffffffffffe48;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe50;
  basic_string_view<char,_std::char_traits<char>_> *this_01;
  tuple<char_data_*&,_const_char_(&)[71]> *in_stack_fffffffffffffe60;
  CQueue *this_02;
  unsigned_long *in_stack_fffffffffffffe70;
  CLogger *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1_00;
  vector<char_data_*,_std::allocator<char_data_*>_> *this_03;
  char *in_stack_fffffffffffffe98;
  queueEntry_t qStack_148;
  string local_c8 [56];
  undefined1 auStack_90 [72];
  pointer local_48;
  int local_c;
  
  local_c = in_ESI;
  if (in_ESI < 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    local_48 = (pointer)0x2;
    fmt._M_str = (char *)in_RDX;
    fmt._M_len = (size_t)in_RCX;
    CLogger::Warn<unsigned_long>(in_stack_fffffffffffffe78,fmt,in_stack_fffffffffffffe70);
  }
  this_02 = (CQueue *)(auStack_90 + 0x38);
  std::tuple<char_data_*&,_const_char_(&)[71]>::tuple<true,_true>
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,(char (*) [71])0x73ddc5);
  GetCharacterData<char_data*&,char_const(&)[71]>(this_02,in_stack_fffffffffffffe60);
  qStack_148.charList.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = local_c;
  args_1_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &qStack_148.function;
  this_03 = in_RDI;
  std::__cxx11::string::string((string *)args_1_00,in_RDX);
  std::__cxx11::string::string(local_c8,(string *)in_RCX);
  std::vector<char_data_*,_std::allocator<char_data_*>_>::vector
            (this_03,(vector<char_data_*,_std::allocator<char_data_*>_> *)in_RDX);
  __x = (value_type *)auStack_90;
  this_00 = &qStack_148;
  this_01 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
  do {
    *(undefined1 *)((long)&this_01->_M_len + (long)&this_00->timer) =
         *(undefined1 *)((long)&this_01->_M_len + (long)&in_stack_00000008->func);
    this_01 = (basic_string_view<char,_std::char_traits<char>_> *)((long)&this_01->_M_len + 1);
  } while (this_01 != (basic_string_view<char,_std::char_traits<char>_> *)0x47);
  std::function<void()>::
  function<CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,char_const(&)[71]>(int,std::__cxx11::string,std::__cxx11::string,void(*)(char_data*,std::__cxx11::string),char_data*&,char_const(&)[71])::_lambda()_1_,void>
            ((function<void_()> *)0x47,in_stack_00000008);
  std::vector<CQueue::queueEntry_t,_std::allocator<CQueue::queueEntry_t>_>::push_back
            ((vector<CQueue::queueEntry_t,_std::allocator<CQueue::queueEntry_t>_> *)this_00,__x);
  queueEntry_t::~queueEntry_t(this_00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (this_01,(char *)in_stack_00000008);
  fmt_00._M_str = in_stack_fffffffffffffe98;
  fmt_00._M_len = (size_t)this_03;
  CLogger::Warn<std::__cxx11::string&,std::__cxx11::string&,int&>
            ((CLogger *)in_RDX,fmt_00,in_RCX,args_1_00,(int *)in_RDI);
  std::vector<char_data_*,_std::allocator<char_data_*>_>::~vector
            ((vector<char_data_*,_std::allocator<char_data_*>_> *)this_01);
  return;
}

Assistant:

void AddToQueue(int nTimer, std::string from, std::string funcName, Func func, Args &&...args)
	{
		if(nTimer < 0)
			Logger.Warn("Negative Queue Timer - NumArgs: {}", sizeof...(Args));	

		// print parameters
		//((std::cout << ' ' << args << std::endl), ...);

		// capture parameter pack
		auto tuple = std::tuple<Args...>(args...);
		auto chs = GetCharacterData(tuple);

		// place on queue
		newQueue.push_back({nTimer, from, funcName, chs, [=] () mutable
		{
			std::apply(func, std::forward_as_tuple(std::forward<Args>(args)...));
		}});

		Logger.Warn("Add => {} added {} with timer {}", from, funcName, nTimer);
	}